

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O2

void __thiscall NaNNUnit::SetInputScale(NaNNUnit *this,NaReal *yMin,NaReal *yMax)

{
  NaReal NVar1;
  uint uVar2;
  NaReal *pNVar3;
  undefined4 *puVar4;
  ulong uVar5;
  uint uVar6;
  
  if ((yMin != (NaReal *)0x0) && (yMax != (NaReal *)0x0)) {
    for (uVar6 = 0; uVar6 < (this->descr).nInputsRepeat; uVar6 = uVar6 + 1) {
      for (uVar5 = 0; uVar2 = (this->descr).nInputsNumber, uVar5 < uVar2; uVar5 = uVar5 + 1) {
        NVar1 = yMin[uVar5];
        pNVar3 = NaVector::operator[](&(this->InputScaler).min,uVar2 * uVar6 + (int)uVar5);
        *pNVar3 = NVar1;
        NVar1 = yMax[uVar5];
        pNVar3 = NaVector::operator[]
                           (&(this->InputScaler).max,
                            (this->descr).nInputsNumber * uVar6 + (int)uVar5);
        *pNVar3 = NVar1;
      }
    }
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

void
NaNNUnit::SetInputScale (const NaReal* yMin, const NaReal* yMax)
{
    if(NULL == yMin || NULL == yMax)
        throw(na_null_pointer);

    unsigned    i, j;
    for(i = 0; i < descr.nInputsRepeat; ++i){
        for(j = 0; j < descr.nInputsNumber; ++j){
            InputScaler.min[i * descr.nInputsNumber + j] = yMin[j];
            InputScaler.max[i * descr.nInputsNumber + j] = yMax[j];
        }
    }
}